

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avx512vnni.cpp
# Opt level: O1

void ncnn::transpose_pack_A_tile_int8_avx512vnni(Mat *A,Mat *AT,int i,int max_ii,int k,int max_kk)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  void *pvVar6;
  undefined8 uVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  undefined1 (*pauVar12) [16];
  long lVar13;
  ulong *puVar14;
  undefined1 *puVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  long lVar19;
  undefined1 (*pauVar20) [64];
  int iVar21;
  uint uVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  ulong uVar34;
  int iVar35;
  ulong uVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [64];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 in_ZMM4 [64];
  ulong local_b0;
  long local_80;
  long local_50;
  
  iVar17 = A->w;
  lVar30 = (long)iVar17;
  pauVar20 = (undefined1 (*) [64])AT->data;
  uVar18 = 0;
  lVar8 = (long)k;
  lVar23 = (long)i;
  if (0xf < max_ii) {
    lVar24 = (long)(iVar17 * 4);
    lVar27 = iVar17 * 3 + lVar23;
    lVar10 = lVar23 + iVar17 * 2;
    lVar33 = lVar23 + lVar30;
    auVar39 = vpbroadcastd_avx512f(ZEXT416(0x7f7f7f7f));
    lVar29 = lVar23;
    uVar34 = 0;
    do {
      pvVar6 = A->data;
      lVar31 = A->w * lVar8 * A->elemsize;
      if (max_kk < 4) {
        lVar19 = (long)pvVar6 + lVar23 + uVar34;
        auVar43 = ZEXT1664((undefined1  [16])0x0);
        uVar9 = 0;
      }
      else {
        lVar19 = (long)pvVar6 + lVar29;
        lVar25 = (long)pvVar6 + lVar27;
        lVar28 = (long)pvVar6 + lVar10;
        lVar11 = (long)pvVar6 + lVar33;
        auVar43 = ZEXT1664((undefined1  [16])0x0);
        iVar21 = 3;
        do {
          auVar48 = vpunpcklbw_avx(*(undefined1 (*) [16])(lVar19 + lVar31),
                                   *(undefined1 (*) [16])(lVar11 + lVar31));
          auVar44 = vpunpckhbw_avx(*(undefined1 (*) [16])(lVar19 + lVar31),
                                   *(undefined1 (*) [16])(lVar11 + lVar31));
          auVar49 = vpunpcklbw_avx(*(undefined1 (*) [16])(lVar28 + lVar31),
                                   *(undefined1 (*) [16])(lVar25 + lVar31));
          auVar37 = vpunpckhbw_avx(*(undefined1 (*) [16])(lVar28 + lVar31),
                                   *(undefined1 (*) [16])(lVar25 + lVar31));
          in_ZMM4 = ZEXT1664(auVar37);
          auVar42 = vpunpcklwd_avx(auVar48,auVar49);
          auVar48 = vpunpckhwd_avx(auVar48,auVar49);
          auVar49 = vpunpcklwd_avx(auVar44,auVar37);
          auVar44 = vpunpckhwd_avx(auVar44,auVar37);
          auVar38._0_16_ = ZEXT116(0) * auVar44 + ZEXT116(1) * auVar49;
          auVar38._16_16_ = ZEXT116(1) * auVar44;
          auVar40 = vinserti64x4_avx512f
                              (ZEXT3264(CONCAT1616(ZEXT116(1) * auVar48,
                                                   ZEXT116(0) * auVar48 + ZEXT116(1) * auVar42)),
                               auVar38,1);
          auVar43 = vpdpbusd_avx512_vnni(auVar43,auVar39,auVar40);
          auVar40 = vmovdqu64_avx512f(auVar40);
          *pauVar20 = auVar40;
          pauVar20 = pauVar20 + 1;
          lVar19 = lVar19 + lVar24;
          lVar25 = lVar25 + lVar24;
          lVar28 = lVar28 + lVar24;
          lVar11 = lVar11 + lVar24;
          iVar21 = iVar21 + 4;
          uVar9 = max_kk & 0xfffffffc;
        } while (iVar21 < max_kk);
      }
      pauVar12 = (undefined1 (*) [16])(lVar19 + lVar31);
      if (3 < max_kk) {
        auVar43 = vmovdqu64_avx512f(auVar43);
        *pauVar20 = auVar43;
        pauVar20 = pauVar20 + 1;
      }
      uVar22 = uVar9 | 1;
      while ((int)uVar22 < max_kk) {
        auVar37 = vpunpcklbw_avx(*pauVar12,*(undefined1 (*) [16])(*pauVar12 + lVar30));
        auVar44 = vpunpckhbw_avx(*pauVar12,*(undefined1 (*) [16])(*pauVar12 + lVar30));
        *(undefined1 (*) [16])*pauVar20 = auVar37;
        *(undefined1 (*) [16])(*pauVar20 + 0x10) = auVar44;
        pauVar20 = (undefined1 (*) [64])(*pauVar20 + 0x20);
        pauVar12 = (undefined1 (*) [16])(*pauVar12 + iVar17 * 2);
        uVar22 = uVar9 + 3;
        uVar9 = uVar9 + 2;
      }
      iVar21 = max_kk - uVar9;
      if (iVar21 != 0 && (int)uVar9 <= max_kk) {
        do {
          uVar7 = *(undefined8 *)(*pauVar12 + 8);
          *(undefined8 *)*pauVar20 = *(undefined8 *)*pauVar12;
          *(undefined8 *)(*pauVar20 + 8) = uVar7;
          pauVar20 = (undefined1 (*) [64])(*pauVar20 + 0x10);
          pauVar12 = (undefined1 (*) [16])(*pauVar12 + lVar30);
          iVar21 = iVar21 + -1;
        } while (iVar21 != 0);
      }
      uVar18 = uVar34 + 0x10;
      uVar36 = uVar34 + 0x1f;
      lVar29 = lVar29 + 0x10;
      lVar27 = lVar27 + 0x10;
      lVar10 = lVar10 + 0x10;
      lVar33 = lVar33 + 0x10;
      uVar34 = uVar18;
    } while (uVar36 < (uint)max_ii);
  }
  lVar10 = (long)max_ii;
  if ((int)((uint)uVar18 | 7) < max_ii) {
    lVar31 = (long)(iVar17 * 4);
    lVar33 = lVar23 + (uVar18 & 0xffffffff);
    lVar27 = iVar17 * 3 + lVar33;
    lVar29 = lVar33 + iVar17 * 2;
    lVar24 = lVar33 + lVar30;
    auVar41._8_4_ = 0x7f7f7f7f;
    auVar41._0_8_ = 0x7f7f7f7f7f7f7f7f;
    auVar41._12_4_ = 0x7f7f7f7f;
    auVar41._16_4_ = 0x7f7f7f7f;
    auVar41._20_4_ = 0x7f7f7f7f;
    auVar41._24_4_ = 0x7f7f7f7f;
    auVar41._28_4_ = 0x7f7f7f7f;
    uVar34 = uVar18 & 0xffffffff;
    do {
      pvVar6 = A->data;
      lVar19 = A->w * lVar8 * A->elemsize;
      if (max_kk < 4) {
        lVar25 = (long)pvVar6 + lVar23 + uVar34;
        auVar38 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        uVar9 = 0;
      }
      else {
        lVar25 = (long)pvVar6 + lVar33;
        lVar28 = (long)pvVar6 + lVar27;
        lVar11 = (long)pvVar6 + lVar29;
        lVar13 = (long)pvVar6 + lVar24;
        auVar39 = ZEXT1664((undefined1  [16])0x0);
        iVar21 = 3;
        do {
          auVar44._8_8_ = 0;
          auVar44._0_8_ = *(ulong *)(lVar25 + lVar19);
          auVar37._8_8_ = 0;
          auVar37._0_8_ = *(ulong *)(lVar13 + lVar19);
          auVar44 = vpunpcklbw_avx(auVar44,auVar37);
          auVar48._8_8_ = 0;
          auVar48._0_8_ = *(ulong *)(lVar11 + lVar19);
          auVar49._8_8_ = 0;
          auVar49._0_8_ = *(ulong *)(lVar28 + lVar19);
          auVar37 = vpunpcklbw_avx(auVar48,auVar49);
          auVar48 = vpunpcklwd_avx(auVar44,auVar37);
          in_ZMM4 = ZEXT1664(auVar48);
          auVar44 = vpunpckhwd_avx(auVar44,auVar37);
          auVar47._0_16_ = ZEXT116(0) * auVar44 + ZEXT116(1) * auVar48;
          auVar47._16_16_ = ZEXT116(1) * auVar44;
          auVar38 = vpdpbusd_avx512_vnni(auVar39._0_32_,auVar41,auVar47);
          auVar39 = ZEXT3264(auVar38);
          *(undefined1 (*) [32])*pauVar20 = auVar47;
          pauVar20 = (undefined1 (*) [64])(*pauVar20 + 0x20);
          lVar25 = lVar25 + lVar31;
          lVar28 = lVar28 + lVar31;
          lVar11 = lVar11 + lVar31;
          lVar13 = lVar13 + lVar31;
          iVar21 = iVar21 + 4;
          uVar9 = max_kk & 0xfffffffc;
        } while (iVar21 < max_kk);
      }
      puVar14 = (ulong *)(lVar25 + lVar19);
      if (3 < max_kk) {
        *(undefined1 (*) [32])*pauVar20 = auVar38;
        pauVar20 = (undefined1 (*) [64])(*pauVar20 + 0x20);
      }
      uVar22 = uVar9 | 1;
      while ((int)uVar22 < max_kk) {
        auVar42._8_8_ = 0;
        auVar42._0_8_ = *puVar14;
        auVar45._8_8_ = 0;
        auVar45._0_8_ = *(ulong *)((long)puVar14 + lVar30);
        auVar44 = vpunpcklbw_avx(auVar42,auVar45);
        *(undefined1 (*) [16])*pauVar20 = auVar44;
        pauVar20 = (undefined1 (*) [64])(*pauVar20 + 0x10);
        puVar14 = (ulong *)((long)puVar14 + (long)(iVar17 * 2));
        uVar22 = uVar9 + 3;
        uVar9 = uVar9 + 2;
      }
      iVar21 = max_kk - uVar9;
      if (iVar21 != 0 && (int)uVar9 <= max_kk) {
        do {
          *(ulong *)*pauVar20 = *puVar14;
          pauVar20 = (undefined1 (*) [64])(*pauVar20 + 8);
          puVar14 = (ulong *)((long)puVar14 + lVar30);
          iVar21 = iVar21 + -1;
        } while (iVar21 != 0);
      }
      uVar18 = uVar34 + 8;
      lVar19 = uVar34 + 0xf;
      lVar33 = lVar33 + 8;
      lVar27 = lVar27 + 8;
      lVar29 = lVar29 + 8;
      lVar24 = lVar24 + 8;
      uVar34 = uVar18;
    } while (lVar19 < lVar10);
  }
  auVar44 = _DAT_005f3a40;
  if ((int)((uint)uVar18 | 3) < max_ii) {
    auVar37 = vpbroadcastd_avx512vl();
    vpmulld_avx(auVar37,_DAT_005f34d0);
    auVar46._8_4_ = 0x7f7f7f7f;
    auVar46._0_8_ = 0x7f7f7f7f7f7f7f7f;
    auVar46._12_4_ = 0x7f7f7f7f;
    uVar34 = uVar18 & 0xffffffff;
    do {
      puVar15 = (undefined1 *)((long)A->data + lVar23 + uVar34 + A->w * lVar8 * A->elemsize);
      auVar39 = ZEXT1664((undefined1  [16])0x0);
      auVar37 = (undefined1  [16])0x0;
      uVar9 = 0;
      if (3 < max_kk) {
        iVar21 = 3;
        do {
          auVar37 = vpcmpeqd_avx(in_ZMM4._0_16_,in_ZMM4._0_16_);
          auVar37 = vpgatherdd((undefined1  [16])0x0,auVar37);
          auVar48 = vpshufb_avx(auVar37,auVar44);
          in_ZMM4 = ZEXT1664(auVar48);
          auVar37 = vpdpbusd_avx512_vnni(auVar39._0_16_,auVar46,auVar48);
          auVar39 = ZEXT1664(auVar37);
          *(undefined1 (*) [16])*pauVar20 = auVar48;
          pauVar20 = (undefined1 (*) [64])(*pauVar20 + 0x10);
          puVar15 = puVar15 + lVar30 * 4;
          iVar21 = iVar21 + 4;
          uVar9 = max_kk & 0xfffffffc;
        } while (iVar21 < max_kk);
      }
      if (3 < max_kk) {
        *(undefined1 (*) [16])*pauVar20 = auVar37;
        pauVar20 = (undefined1 (*) [64])(*pauVar20 + 0x10);
      }
      uVar22 = uVar9 | 1;
      while ((int)uVar22 < max_kk) {
        (*pauVar20)[0] = *puVar15;
        (*pauVar20)[1] = puVar15[lVar30];
        (*pauVar20)[2] = puVar15[1];
        (*pauVar20)[3] = puVar15[iVar17 + 1];
        (*pauVar20)[4] = puVar15[2];
        (*pauVar20)[5] = puVar15[iVar17 + 2];
        (*pauVar20)[6] = puVar15[3];
        (*pauVar20)[7] = puVar15[iVar17 + 3];
        pauVar20 = (undefined1 (*) [64])(*pauVar20 + 8);
        puVar15 = puVar15 + lVar30 * 2;
        uVar22 = uVar9 + 3;
        uVar9 = uVar9 + 2;
      }
      iVar21 = max_kk - uVar9;
      if (iVar21 != 0 && (int)uVar9 <= max_kk) {
        puVar15 = puVar15 + 3;
        do {
          (*pauVar20)[0] = puVar15[-3];
          (*pauVar20)[1] = puVar15[-2];
          (*pauVar20)[2] = puVar15[-1];
          (*pauVar20)[3] = *puVar15;
          pauVar20 = (undefined1 (*) [64])(*pauVar20 + 4);
          puVar15 = puVar15 + lVar30;
          iVar21 = iVar21 + -1;
        } while (iVar21 != 0);
      }
      uVar18 = uVar34 + 4;
      lVar33 = uVar34 + 7;
      uVar34 = uVar18;
    } while (lVar33 < lVar10);
  }
  uVar9 = (uint)uVar18;
  if ((int)(uVar9 | 1) < max_ii) {
    lVar27 = (long)(iVar17 * 4);
    lVar33 = (int)uVar9 + lVar23;
    lVar24 = (iVar17 * 3 + 1) + lVar33;
    lVar29 = lVar33 + (iVar17 + 1);
    lVar31 = iVar17 * 3 + lVar33;
    local_80 = lVar33 + iVar17 * 2;
    local_50 = lVar33 + lVar30;
    local_b0 = (long)(int)uVar9;
    do {
      pvVar6 = A->data;
      lVar19 = A->w * lVar8 * A->elemsize;
      if (max_kk < 4) {
        lVar25 = (long)pvVar6 + lVar23 + local_b0;
        uVar9 = 0;
        iVar21 = 0;
        iVar35 = 0;
      }
      else {
        lVar25 = (long)pvVar6 + lVar33;
        lVar28 = (long)pvVar6 + lVar24;
        lVar11 = (long)pvVar6 + lVar29;
        lVar13 = (long)pvVar6 + lVar31;
        lVar32 = (long)pvVar6 + local_80;
        lVar26 = (long)pvVar6 + local_50;
        iVar35 = 0;
        iVar16 = 3;
        iVar21 = 0;
        do {
          cVar1 = *(char *)(lVar25 + lVar19);
          (*pauVar20)[0] = cVar1;
          cVar2 = *(char *)(lVar26 + lVar19);
          (*pauVar20)[1] = cVar2;
          cVar3 = *(char *)(lVar32 + lVar19);
          (*pauVar20)[2] = cVar3;
          cVar4 = *(char *)(lVar13 + lVar19);
          (*pauVar20)[3] = cVar4;
          cVar5 = *(char *)(lVar25 + 1 + lVar19);
          (*pauVar20)[4] = cVar5;
          iVar21 = iVar21 + cVar1 + (int)cVar2 + (int)cVar3 + (int)cVar4;
          cVar1 = *(char *)(lVar11 + lVar19);
          (*pauVar20)[5] = cVar1;
          cVar2 = *(char *)(lVar32 + 1 + lVar19);
          (*pauVar20)[6] = cVar2;
          cVar3 = *(char *)(lVar28 + lVar19);
          (*pauVar20)[7] = cVar3;
          iVar35 = iVar35 + cVar5 + (int)cVar1 + (int)cVar2 + (int)cVar3;
          pauVar20 = (undefined1 (*) [64])(*pauVar20 + 8);
          iVar16 = iVar16 + 4;
          lVar25 = lVar25 + lVar27;
          lVar28 = lVar28 + lVar27;
          lVar11 = lVar11 + lVar27;
          lVar13 = lVar13 + lVar27;
          lVar32 = lVar32 + lVar27;
          lVar26 = lVar26 + lVar27;
        } while (iVar16 < max_kk);
        iVar21 = iVar21 * 0x7f;
        iVar35 = iVar35 * 0x7f;
        uVar9 = max_kk & 0xfffffffc;
      }
      puVar15 = (undefined1 *)(lVar25 + lVar19);
      if (3 < max_kk) {
        *(int *)*pauVar20 = iVar21;
        *(int *)(*pauVar20 + 4) = iVar35;
        pauVar20 = (undefined1 (*) [64])(*pauVar20 + 8);
      }
      uVar22 = uVar9 | 1;
      while ((int)uVar22 < max_kk) {
        (*pauVar20)[0] = *puVar15;
        (*pauVar20)[1] = puVar15[lVar30];
        (*pauVar20)[2] = puVar15[1];
        (*pauVar20)[3] = puVar15[iVar17 + 1];
        pauVar20 = (undefined1 (*) [64])(*pauVar20 + 4);
        puVar15 = puVar15 + iVar17 * 2;
        uVar22 = uVar9 + 3;
        uVar9 = uVar9 + 2;
      }
      iVar21 = max_kk - uVar9;
      if (iVar21 != 0 && (int)uVar9 <= max_kk) {
        puVar15 = puVar15 + 1;
        do {
          (*pauVar20)[0] = puVar15[-1];
          (*pauVar20)[1] = *puVar15;
          pauVar20 = (undefined1 (*) [64])(*pauVar20 + 2);
          puVar15 = puVar15 + lVar30;
          iVar21 = iVar21 + -1;
        } while (iVar21 != 0);
      }
      uVar18 = local_b0 + 2;
      lVar19 = local_b0 + 3;
      lVar33 = lVar33 + 2;
      lVar24 = lVar24 + 2;
      lVar29 = lVar29 + 2;
      lVar31 = lVar31 + 2;
      local_80 = local_80 + 2;
      local_50 = local_50 + 2;
      local_b0 = uVar18;
    } while (lVar19 < lVar10);
  }
  if ((int)uVar18 < max_ii) {
    lVar31 = (long)(iVar17 * 4);
    lVar24 = (long)(int)uVar18;
    lVar33 = lVar24 + lVar23;
    lVar27 = iVar17 * 3 + lVar33;
    lVar19 = iVar17 * 2 + lVar33;
    lVar29 = lVar33 + lVar30;
    do {
      pvVar6 = A->data;
      lVar25 = A->w * lVar8 * A->elemsize;
      if (max_kk < 4) {
        lVar28 = (long)pvVar6 + lVar23 + lVar24;
        uVar9 = 0;
        iVar17 = 0;
      }
      else {
        lVar28 = lVar33 + (long)pvVar6;
        lVar11 = (long)pvVar6 + lVar27;
        lVar13 = (long)pvVar6 + lVar19;
        lVar32 = (long)pvVar6 + lVar29;
        iVar17 = 0;
        iVar21 = 3;
        do {
          cVar1 = *(char *)(lVar28 + lVar25);
          (*pauVar20)[0] = cVar1;
          cVar2 = *(char *)(lVar32 + lVar25);
          (*pauVar20)[1] = cVar2;
          cVar3 = *(char *)(lVar13 + lVar25);
          (*pauVar20)[2] = cVar3;
          cVar4 = *(char *)(lVar11 + lVar25);
          (*pauVar20)[3] = cVar4;
          iVar17 = iVar17 + cVar1 + (int)cVar2 + (int)cVar3 + (int)cVar4;
          pauVar20 = (undefined1 (*) [64])(*pauVar20 + 4);
          iVar21 = iVar21 + 4;
          lVar28 = lVar28 + lVar31;
          lVar11 = lVar11 + lVar31;
          lVar13 = lVar13 + lVar31;
          lVar32 = lVar32 + lVar31;
        } while (iVar21 < max_kk);
        iVar17 = iVar17 * 0x7f;
        uVar9 = max_kk & 0xfffffffc;
      }
      puVar15 = (undefined1 *)(lVar28 + lVar25);
      if (3 < max_kk) {
        *(int *)*pauVar20 = iVar17;
        pauVar20 = (undefined1 (*) [64])(*pauVar20 + 4);
      }
      iVar17 = max_kk - uVar9;
      if (iVar17 != 0 && (int)uVar9 <= max_kk) {
        do {
          (*pauVar20)[0] = *puVar15;
          pauVar20 = (undefined1 (*) [64])(*pauVar20 + 1);
          puVar15 = puVar15 + lVar30;
          iVar17 = iVar17 + -1;
        } while (iVar17 != 0);
      }
      lVar24 = lVar24 + 1;
      lVar33 = lVar33 + 1;
      lVar27 = lVar27 + 1;
      lVar19 = lVar19 + 1;
      lVar29 = lVar29 + 1;
    } while (lVar24 != lVar10);
  }
  return;
}

Assistant:

void transpose_pack_A_tile_int8_avx512vnni(const Mat& A, Mat& AT, int i, int max_ii, int k, int max_kk)
{
    transpose_pack_A_tile_int8(A, AT, i, max_ii, k, max_kk);
}